

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O1

void decorr_stereo_pass(decorr_pass *dpp,int32_t *buffer,int32_t sample_count)

{
  uint *puVar1;
  ushort uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  long in_FS_OFFSET;
  int32_t temp_samples [8];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar10 = (int)dpp->delta;
  iVar5 = (int)dpp->weight_A;
  iVar4 = (int)dpp->weight_B;
  puVar1 = (uint *)(buffer + (uint)(sample_count * 2));
  uVar2 = dpp->term;
  uVar12 = (uint)uVar2;
  if (uVar2 < 0xfffd) {
    if (uVar2 == 0x11) {
      if (sample_count != 0) {
        do {
          iVar11 = dpp->samples_A[1];
          iVar8 = dpp->samples_A[0] * 2;
          uVar12 = iVar8 - iVar11;
          dpp->samples_A[1] = dpp->samples_A[0];
          if ((int)(short)(ushort)uVar12 == uVar12) {
            iVar13 = (int)(uVar12 * iVar5 + 0x200) >> 10;
          }
          else {
            iVar13 = (int)(((ulong)(long)(int)uVar12 >> 9 & 0x1ffffff80) * (long)iVar5 +
                           ((ulong)(ushort)uVar12 * (long)iVar5 >> 9) + 1 >> 1);
          }
          uVar6 = *buffer;
          dpp->samples_A[0] = iVar13 + uVar6;
          if ((iVar8 != iVar11) && (*buffer != 0)) {
            iVar5 = iVar5 + ((int)(*buffer ^ uVar12) >> 0x1e | 1U) * iVar10;
          }
          *buffer = iVar13 + uVar6;
          iVar11 = dpp->samples_B[1];
          iVar8 = dpp->samples_B[0] * 2;
          uVar12 = iVar8 - iVar11;
          dpp->samples_B[1] = dpp->samples_B[0];
          if ((int)(short)(ushort)uVar12 == uVar12) {
            iVar13 = (int)(uVar12 * iVar4 + 0x200) >> 10;
          }
          else {
            iVar13 = (int)(((ulong)(long)(int)uVar12 >> 9 & 0x1ffffff80) * (long)iVar4 +
                           ((ulong)(ushort)uVar12 * (long)iVar4 >> 9) + 1 >> 1);
          }
          uVar6 = ((uint *)buffer)[1];
          dpp->samples_B[0] = iVar13 + uVar6;
          if ((iVar8 != iVar11) && (((uint *)buffer)[1] != 0)) {
            iVar4 = iVar4 + ((int)(((uint *)buffer)[1] ^ uVar12) >> 0x1e | 1U) * iVar10;
          }
          ((uint *)buffer)[1] = iVar13 + uVar6;
          buffer = (int32_t *)((uint *)buffer + 2);
        } while (buffer < puVar1);
      }
      goto LAB_001b2cf4;
    }
    if (uVar2 == 0x12) {
      if (sample_count != 0) {
        do {
          uVar6 = dpp->samples_A[0] * 3 - dpp->samples_A[1];
          uVar12 = (int)uVar6 >> 1;
          dpp->samples_A[1] = dpp->samples_A[0];
          if ((int)(short)(ushort)uVar12 == uVar12) {
            iVar11 = (int)(uVar12 * iVar5 + 0x200) >> 10;
          }
          else {
            iVar11 = (int)(((ulong)(long)(int)uVar12 >> 9 & 0x1ffffff80) * (long)iVar5 +
                           ((ulong)(ushort)uVar12 * (long)iVar5 >> 9) + 1 >> 1);
          }
          uVar3 = *buffer;
          dpp->samples_A[0] = iVar11 + uVar3;
          if ((1 < uVar6) && (*buffer != 0)) {
            iVar5 = iVar5 + ((int)(*buffer ^ uVar12) >> 0x1e | 1U) * iVar10;
          }
          *buffer = iVar11 + uVar3;
          uVar6 = dpp->samples_B[0] * 3 - dpp->samples_B[1];
          uVar12 = (int)uVar6 >> 1;
          dpp->samples_B[1] = dpp->samples_B[0];
          if ((int)(short)(ushort)uVar12 == uVar12) {
            iVar11 = (int)(uVar12 * iVar4 + 0x200) >> 10;
          }
          else {
            iVar11 = (int)(((ulong)(long)(int)uVar12 >> 9 & 0x1ffffff80) * (long)iVar4 +
                           ((ulong)(ushort)uVar12 * (long)iVar4 >> 9) + 1 >> 1);
          }
          uVar3 = ((uint *)buffer)[1];
          dpp->samples_B[0] = iVar11 + uVar3;
          if ((1 < uVar6) && (((uint *)buffer)[1] != 0)) {
            iVar4 = iVar4 + ((int)(((uint *)buffer)[1] ^ uVar12) >> 0x1e | 1U) * iVar10;
          }
          ((uint *)buffer)[1] = iVar11 + uVar3;
          buffer = (int32_t *)((uint *)buffer + 2);
        } while (buffer < puVar1);
      }
      goto LAB_001b2cf4;
    }
  }
  else {
    if (uVar2 == 0xffff) {
      if (sample_count != 0) {
        do {
          uVar12 = dpp->samples_A[0];
          if ((int)(short)uVar12 == uVar12) {
            iVar11 = (int)(uVar12 * iVar5 + 0x200) >> 10;
          }
          else {
            iVar11 = (int)(((ulong)(uVar12 & 0xffff) * (long)iVar5 >> 9) +
                           ((ulong)(long)(int)uVar12 >> 9 & 0x1ffffff80) * (long)iVar5 + 1 >> 1);
          }
          uVar6 = *buffer;
          if (uVar6 != 0 && uVar12 != 0) {
            if ((int)(uVar12 ^ uVar6) < 0) {
              iVar5 = iVar5 - iVar10;
              iVar8 = -0x400;
              if (iVar5 < -0x400) goto LAB_001b284c;
            }
            else {
              iVar5 = iVar5 + iVar10;
              iVar8 = 0x400;
              if (0x400 < iVar5) {
LAB_001b284c:
                iVar5 = iVar8;
              }
            }
          }
          uVar6 = iVar11 + uVar6;
          *buffer = uVar6;
          if ((int)(short)uVar6 == uVar6) {
            iVar11 = (int)(uVar6 * iVar4 + 0x200) >> 10;
          }
          else {
            iVar11 = (int)(((ulong)(long)(int)uVar6 >> 9 & 0x1ffffff80) * (long)iVar4 +
                           (((long)(int)uVar6 & 0xffffU) * (long)iVar4 >> 9) + 1 >> 1);
          }
          uVar12 = ((uint *)buffer)[1];
          dpp->samples_A[0] = iVar11 + uVar12;
          if ((uVar6 != 0) && (((uint *)buffer)[1] != 0)) {
            if ((int)(((uint *)buffer)[1] ^ uVar6) < 0) {
              iVar4 = iVar4 - iVar10;
              iVar8 = -0x400;
              if (iVar4 < -0x400) goto LAB_001b28c1;
            }
            else {
              iVar4 = iVar4 + iVar10;
              iVar8 = 0x400;
              if (0x400 < iVar4) {
LAB_001b28c1:
                iVar4 = iVar8;
              }
            }
          }
          ((uint *)buffer)[1] = iVar11 + uVar12;
          buffer = (int32_t *)((uint *)buffer + 2);
        } while (buffer < puVar1);
      }
      goto LAB_001b2cf4;
    }
    if (uVar12 == 0xfffe) {
      if (sample_count != 0) {
        do {
          uVar12 = dpp->samples_B[0];
          if ((int)(short)uVar12 == uVar12) {
            iVar11 = (int)(uVar12 * iVar4 + 0x200) >> 10;
          }
          else {
            iVar11 = (int)(((ulong)(uVar12 & 0xffff) * (long)iVar4 >> 9) +
                           ((ulong)(long)(int)uVar12 >> 9 & 0x1ffffff80) * (long)iVar4 + 1 >> 1);
          }
          uVar6 = ((uint *)buffer)[1];
          if (uVar6 != 0 && uVar12 != 0) {
            if ((int)(uVar12 ^ uVar6) < 0) {
              iVar4 = iVar4 - iVar10;
              iVar8 = -0x400;
              if (iVar4 < -0x400) goto LAB_001b298d;
            }
            else {
              iVar4 = iVar4 + iVar10;
              iVar8 = 0x400;
              if (0x400 < iVar4) {
LAB_001b298d:
                iVar4 = iVar8;
              }
            }
          }
          uVar6 = iVar11 + uVar6;
          ((uint *)buffer)[1] = uVar6;
          if ((int)(short)uVar6 == uVar6) {
            iVar11 = (int)(uVar6 * iVar5 + 0x200) >> 10;
          }
          else {
            iVar11 = (int)(((ulong)(long)(int)uVar6 >> 9 & 0x1ffffff80) * (long)iVar5 +
                           (((long)(int)uVar6 & 0xffffU) * (long)iVar5 >> 9) + 1 >> 1);
          }
          uVar12 = *buffer;
          dpp->samples_B[0] = iVar11 + uVar12;
          if ((uVar6 != 0) && (*buffer != 0)) {
            if ((int)(*buffer ^ uVar6) < 0) {
              iVar5 = iVar5 - iVar10;
              iVar8 = -0x400;
              if (iVar5 < -0x400) goto LAB_001b2a02;
            }
            else {
              iVar5 = iVar5 + iVar10;
              iVar8 = 0x400;
              if (0x400 < iVar5) {
LAB_001b2a02:
                iVar5 = iVar8;
              }
            }
          }
          *buffer = iVar11 + uVar12;
          buffer = (int32_t *)((uint *)buffer + 2);
        } while (buffer < puVar1);
      }
      goto LAB_001b2cf4;
    }
    if (uVar12 == 0xfffd) {
      if (sample_count != 0) {
        do {
          uVar12 = dpp->samples_A[0];
          if ((int)(short)uVar12 == uVar12) {
            iVar11 = (int)(uVar12 * iVar5 + 0x200) >> 10;
          }
          else {
            iVar11 = (int)(((ulong)(uVar12 & 0xffff) * (long)iVar5 >> 9) +
                           ((ulong)(long)(int)uVar12 >> 9 & 0x1ffffff80) * (long)iVar5 + 1 >> 1);
          }
          uVar6 = *buffer;
          if (uVar6 != 0 && uVar12 != 0) {
            if ((int)(uVar12 ^ uVar6) < 0) {
              iVar5 = iVar5 - iVar10;
              iVar8 = -0x400;
              if (iVar5 < -0x400) goto LAB_001b25d2;
            }
            else {
              iVar5 = iVar5 + iVar10;
              iVar8 = 0x400;
              if (0x400 < iVar5) {
LAB_001b25d2:
                iVar5 = iVar8;
              }
            }
          }
          uVar12 = dpp->samples_B[0];
          if ((int)(short)uVar12 == uVar12) {
            iVar8 = (int)(uVar12 * iVar4 + 0x200) >> 10;
          }
          else {
            iVar8 = (int)(((ulong)(uVar12 & 0xffff) * (long)iVar4 >> 9) +
                          ((ulong)(long)(int)uVar12 >> 9 & 0x1ffffff80) * (long)iVar4 + 1 >> 1);
          }
          uVar3 = ((uint *)buffer)[1];
          if (uVar3 != 0 && uVar12 != 0) {
            if ((int)(uVar12 ^ uVar3) < 0) {
              iVar4 = iVar4 - iVar10;
              iVar13 = -0x400;
              if (iVar4 < -0x400) goto LAB_001b2642;
            }
            else {
              iVar4 = iVar4 + iVar10;
              iVar13 = 0x400;
              if (0x400 < iVar4) {
LAB_001b2642:
                iVar4 = iVar13;
              }
            }
          }
          dpp->samples_B[0] = iVar11 + uVar6;
          *buffer = iVar11 + uVar6;
          dpp->samples_A[0] = iVar8 + uVar3;
          ((uint *)buffer)[1] = iVar8 + uVar3;
          buffer = (int32_t *)((uint *)buffer + 2);
        } while (buffer < puVar1);
      }
      goto LAB_001b2cf4;
    }
  }
  if (sample_count == 0) {
    uVar6 = 0;
  }
  else {
    uVar7 = 0;
    do {
      uVar12 = uVar12 & 7;
      uVar6 = dpp->samples_A[uVar7];
      if ((int)(short)uVar6 == uVar6) {
        iVar11 = (int)(uVar6 * iVar5 + 0x200) >> 10;
      }
      else {
        iVar11 = (int)(((ulong)(uVar6 & 0xffff) * (long)iVar5 >> 9) +
                       ((ulong)(long)(int)uVar6 >> 9 & 0x1ffffff80) * (long)iVar5 + 1 >> 1);
      }
      uVar3 = *buffer;
      dpp->samples_A[uVar12] = iVar11 + uVar3;
      if ((uVar6 != 0) && (*buffer != 0)) {
        iVar5 = iVar5 + ((int)(*buffer ^ uVar6) >> 0x1e | 1U) * iVar10;
      }
      *buffer = iVar11 + uVar3;
      uVar6 = dpp->samples_B[uVar7];
      if ((int)(short)uVar6 == uVar6) {
        iVar11 = (int)(uVar6 * iVar4 + 0x200) >> 10;
      }
      else {
        iVar11 = (int)(((ulong)(uVar6 & 0xffff) * (long)iVar4 >> 9) +
                       ((ulong)(long)(int)uVar6 >> 9 & 0x1ffffff80) * (long)iVar4 + 1 >> 1);
      }
      uVar3 = ((uint *)buffer)[1];
      dpp->samples_B[uVar12] = iVar11 + uVar3;
      if ((uVar6 != 0) && (((uint *)buffer)[1] != 0)) {
        iVar4 = iVar4 + ((int)(((uint *)buffer)[1] ^ uVar6) >> 0x1e | 1U) * iVar10;
      }
      ((uint *)buffer)[1] = iVar11 + uVar3;
      uVar6 = (int)uVar7 + 1U & 7;
      uVar7 = (ulong)uVar6;
      uVar12 = uVar12 + 1;
      buffer = (int32_t *)((uint *)buffer + 2);
    } while (buffer < puVar1);
  }
  if (uVar6 != 0) {
    local_48 = *(undefined8 *)(dpp->samples_A + 4);
    uStack_40 = *(undefined8 *)(dpp->samples_A + 6);
    local_58 = *(undefined8 *)dpp->samples_A;
    uStack_50 = *(undefined8 *)(dpp->samples_A + 2);
    lVar9 = 0;
    do {
      dpp->samples_A[lVar9] = *(int32_t *)((long)&local_58 + (ulong)(uVar6 + (int)lVar9 & 7) * 4);
      lVar9 = lVar9 + 1;
    } while (lVar9 != 8);
    local_48 = *(undefined8 *)(dpp->samples_B + 4);
    uStack_40 = *(undefined8 *)(dpp->samples_B + 6);
    local_58 = *(undefined8 *)dpp->samples_B;
    uStack_50 = *(undefined8 *)(dpp->samples_B + 2);
    uVar6 = uVar6 + 8;
    lVar9 = 0;
    do {
      *(undefined4 *)((long)dpp->samples_B + lVar9) =
           *(undefined4 *)((long)&local_58 + (ulong)(uVar6 & 7) * 4);
      uVar6 = uVar6 + 1;
      lVar9 = lVar9 + 4;
    } while (lVar9 != 0x20);
  }
LAB_001b2cf4:
  dpp->weight_A = (short)iVar5;
  dpp->weight_B = (short)iVar4;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void decorr_stereo_pass (struct decorr_pass *dpp, int32_t *buffer, int32_t sample_count)
{
    int32_t delta = dpp->delta, weight_A = dpp->weight_A, weight_B = dpp->weight_B;
    int32_t *bptr, *eptr = buffer + (sample_count * 2), sam_A, sam_B;
    int m, k;

    switch (dpp->term) {

        case 17:
            for (bptr = buffer; bptr < eptr; bptr += 2) {
                sam_A = 2 * dpp->samples_A [0] - dpp->samples_A [1];
                dpp->samples_A [1] = dpp->samples_A [0];
                dpp->samples_A [0] = apply_weight (weight_A, sam_A) + bptr [0];
                update_weight (weight_A, delta, sam_A, bptr [0]);
                bptr [0] = dpp->samples_A [0];

                sam_A = 2 * dpp->samples_B [0] - dpp->samples_B [1];
                dpp->samples_B [1] = dpp->samples_B [0];
                dpp->samples_B [0] = apply_weight (weight_B, sam_A) + bptr [1];
                update_weight (weight_B, delta, sam_A, bptr [1]);
                bptr [1] = dpp->samples_B [0];
            }

            break;

        case 18:
            for (bptr = buffer; bptr < eptr; bptr += 2) {
                sam_A = (3 * dpp->samples_A [0] - dpp->samples_A [1]) >> 1;
                dpp->samples_A [1] = dpp->samples_A [0];
                dpp->samples_A [0] = apply_weight (weight_A, sam_A) + bptr [0];
                update_weight (weight_A, delta, sam_A, bptr [0]);
                bptr [0] = dpp->samples_A [0];

                sam_A = (3 * dpp->samples_B [0] - dpp->samples_B [1]) >> 1;
                dpp->samples_B [1] = dpp->samples_B [0];
                dpp->samples_B [0] = apply_weight (weight_B, sam_A) + bptr [1];
                update_weight (weight_B, delta, sam_A, bptr [1]);
                bptr [1] = dpp->samples_B [0];
            }

            break;

        default:
            for (m = 0, k = dpp->term & (MAX_TERM - 1), bptr = buffer; bptr < eptr; bptr += 2) {
                sam_A = dpp->samples_A [m];
                dpp->samples_A [k] = apply_weight (weight_A, sam_A) + bptr [0];
                update_weight (weight_A, delta, sam_A, bptr [0]);
                bptr [0] = dpp->samples_A [k];

                sam_A = dpp->samples_B [m];
                dpp->samples_B [k] = apply_weight (weight_B, sam_A) + bptr [1];
                update_weight (weight_B, delta, sam_A, bptr [1]);
                bptr [1] = dpp->samples_B [k];

                m = (m + 1) & (MAX_TERM - 1);
                k = (k + 1) & (MAX_TERM - 1);
            }

            if (m) {
                int32_t temp_samples [MAX_TERM];

                memcpy (temp_samples, dpp->samples_A, sizeof (dpp->samples_A));

                for (k = 0; k < MAX_TERM; k++, m++)
                    dpp->samples_A [k] = temp_samples [m & (MAX_TERM - 1)];

                memcpy (temp_samples, dpp->samples_B, sizeof (dpp->samples_B));

                for (k = 0; k < MAX_TERM; k++, m++)
                    dpp->samples_B [k] = temp_samples [m & (MAX_TERM - 1)];
            }

            break;

        case -1:
            for (bptr = buffer; bptr < eptr; bptr += 2) {
                sam_A = bptr [0] + apply_weight (weight_A, dpp->samples_A [0]);
                update_weight_clip (weight_A, delta, dpp->samples_A [0], bptr [0]);
                bptr [0] = sam_A;
                dpp->samples_A [0] = bptr [1] + apply_weight (weight_B, sam_A);
                update_weight_clip (weight_B, delta, sam_A, bptr [1]);
                bptr [1] = dpp->samples_A [0];
            }

            break;

        case -2:
            for (bptr = buffer; bptr < eptr; bptr += 2) {
                sam_B = bptr [1] + apply_weight (weight_B, dpp->samples_B [0]);
                update_weight_clip (weight_B, delta, dpp->samples_B [0], bptr [1]);
                bptr [1] = sam_B;
                dpp->samples_B [0] = bptr [0] + apply_weight (weight_A, sam_B);
                update_weight_clip (weight_A, delta, sam_B, bptr [0]);
                bptr [0] = dpp->samples_B [0];
            }

            break;

        case -3:
            for (bptr = buffer; bptr < eptr; bptr += 2) {
                sam_A = bptr [0] + apply_weight (weight_A, dpp->samples_A [0]);
                update_weight_clip (weight_A, delta, dpp->samples_A [0], bptr [0]);
                sam_B = bptr [1] + apply_weight (weight_B, dpp->samples_B [0]);
                update_weight_clip (weight_B, delta, dpp->samples_B [0], bptr [1]);
                bptr [0] = dpp->samples_B [0] = sam_A;
                bptr [1] = dpp->samples_A [0] = sam_B;
            }

            break;
    }

    dpp->weight_A = weight_A;
    dpp->weight_B = weight_B;
}